

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::isURIString(XMLCh *uricString)

{
  bool bVar1;
  XMLSize_t XVar2;
  XMLCh *local_20;
  XMLCh *tmpStr;
  XMLCh *uricString_local;
  
  if ((uricString == (XMLCh *)0x0) || (local_20 = uricString, *uricString == L'\0')) {
    uricString_local._7_1_ = false;
  }
  else {
    while (*local_20 != L'\0') {
      bVar1 = isReservedOrUnreservedCharacter(*local_20);
      if (bVar1) {
        local_20 = local_20 + 1;
      }
      else {
        if (*local_20 != L'%') {
          return false;
        }
        XVar2 = XMLString::stringLen(local_20);
        if (((XVar2 < 3) || (bVar1 = XMLString::isHex(local_20[1]), !bVar1)) ||
           (bVar1 = XMLString::isHex(local_20[2]), !bVar1)) {
          return false;
        }
        local_20 = local_20 + 3;
      }
    }
    uricString_local._7_1_ = true;
  }
  return uricString_local._7_1_;
}

Assistant:

bool XMLUri::isURIString(const XMLCh* const uricString)
{
	if (!uricString || !*uricString)
        return false;

    const XMLCh* tmpStr = uricString;

    while (*tmpStr)
    {
        if (isReservedOrUnreservedCharacter(*tmpStr))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >=3
                && XMLString::isHex(*(tmpStr+1))     // 1st hex
                && XMLString::isHex(*(tmpStr+2))  )  // 2nd hex
            {
                tmpStr+=3;
            }
            else
            {
                return false;
            }
        }
        else
        {
            return false;
        }
    }

    return true;
}